

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SccLiveness.cpp
# Opt level: O2

Lifetime * __thiscall
SCCLiveness::InsertLifetime(SCCLiveness *this,StackSym *stackSym,RegNum reg,Instr *currentInstr)

{
  uint uVar1;
  Func *this_00;
  NodeBase *pNVar2;
  bool bVar3;
  uint32 start;
  uint uVar4;
  RegSlot slotIndex;
  Lifetime *this_01;
  Type *ppLVar5;
  undefined1 local_60 [8];
  EditingIterator iter;
  NodeBase local_38;
  Lifetime *newLlifetime;
  
  start = IR::Instr::GetNumber(currentInstr);
  this_01 = (Lifetime *)new<Memory::JitArenaAllocator>(0xa0,this->tempAlloc,0x3d6ef4);
  iter.super_EditingIterator.last = (NodeBase *)stackSym;
  Lifetime::Lifetime(this_01,this->tempAlloc,stackSym,reg,start,start);
  uVar1 = this->totalOpHelperFullVisitedLength;
  local_38.next = (Type)this_01;
  uVar4 = CurrentOpHelperVisitedLength(this,currentInstr);
  this_01->totalOpHelperLengthByEnd = uVar4 + uVar1;
  local_60 = (undefined1  [8])&this->lifetimeList;
  iter.super_EditingIterator.super_Iterator.current = (NodeBase *)0x0;
  iter.super_EditingIterator.super_Iterator.list =
       (SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
  do {
    bVar3 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                      ((EditingIterator *)local_60);
    if (!bVar3) break;
    ppLVar5 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_60);
  } while (start < (*ppLVar5)->start);
  SList<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
            ((EditingIterator *)local_60,(Lifetime **)&local_38);
  bVar3 = Func::IsJitInDebugMode(this->func);
  pNVar2 = iter.super_EditingIterator.last;
  if ((bVar3) && (((ulong)iter.super_EditingIterator.last[3].next & 0x2000) != 0)) {
    this_00 = this->func;
    slotIndex = StackSym::GetByteCodeRegSlot((StackSym *)iter.super_EditingIterator.last);
    bVar3 = Func::IsNonTempLocalVar(this_00,slotIndex);
    if (bVar3) {
      *(ushort *)((long)(local_38.next + 0x13) + 4) =
           *(ushort *)((long)(local_38.next + 0x13) + 4) & 0xfff7;
    }
  }
  pNVar2[9].next = local_38.next;
  return (Lifetime *)local_38.next;
}

Assistant:

Lifetime *
SCCLiveness::InsertLifetime(StackSym *stackSym, RegNum reg, IR::Instr *const currentInstr)
{
    const uint start = currentInstr->GetNumber(), end = start;
    Lifetime * newLlifetime = JitAnew(tempAlloc, Lifetime, tempAlloc, stackSym, reg, start, end);
    newLlifetime->totalOpHelperLengthByEnd = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);

    // Find insertion point
    // This looks like a search, but we should almost exit on the first iteration, except
    // when we have loops and some lifetimes where extended.
    FOREACH_SLIST_ENTRY_EDITING(Lifetime *, lifetime, &this->lifetimeList, iter)
    {
        if (lifetime->start <= start)
        {
            break;
        }
    }
    NEXT_SLIST_ENTRY_EDITING;

    iter.InsertBefore(newLlifetime);

    // let's say 'var a = 10;'. if a is not used in the function, we still want to have the instr, otherwise the write-through will not happen and upon debug bailout
    // we would not be able to restore the values to see in locals window.
    if (this->func->IsJitInDebugMode() && stackSym->HasByteCodeRegSlot() && this->func->IsNonTempLocalVar(stackSym->GetByteCodeRegSlot()))
    {
        newLlifetime->isDeadStore = false;
    }

    stackSym->scratch.linearScan.lifetime = newLlifetime;
    return newLlifetime;
}